

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cast.h
# Opt level: O3

ptr<Value> __thiscall Cast::evaluate(Cast *this,Environment *env)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  _func_int **pp_Var7;
  element_type *peVar8;
  undefined4 *puVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined **ppuVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  ptr<Value> pVar12;
  ptr<Value> value;
  undefined1 local_79;
  long *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Expression local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  _func_int **local_28;
  
  (*(code *)**(undefined8 **)(env->symbols)._M_h._M_bucket_count)(&local_78);
  switch((int)(env->symbols)._M_h._M_element_count) {
  case 1:
    (**(code **)(*local_78 + 0x10))(&local_68);
    local_48._vptr_Expression = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<String,std::allocator<String>,std::__cxx11::string&>
              (&_Stack_40,(String **)&local_48,(allocator<String> *)&local_79,&local_68);
    _Var1._M_pi = _Stack_40._M_pi;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_UnaryOperator).super_Expression._vptr_Expression = local_48._vptr_Expression;
    (this->super_UnaryOperator).expression.
    super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
    local_48._vptr_Expression = (_func_int **)0x0;
    ppuVar11 = (undefined **)extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      ppuVar11 = (undefined **)extraout_RDX_00;
    }
    goto LAB_0011867c;
  case 2:
    local_28 = (_func_int **)(**(code **)(*local_78 + 0x20))();
    peVar8 = (element_type *)operator_new(0x20);
    peVar8[1]._vptr_Expression = (_func_int **)0x100000001;
    peVar8->_vptr_Expression = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f4a0;
    peVar10 = peVar8 + 2;
    ppuVar11 = &PTR__Member_0012f4f0;
    peVar8[2]._vptr_Expression = (_func_int **)&PTR__Member_0012f4f0;
    peVar8[3]._vptr_Expression = local_28;
    break;
  case 3:
    pp_Var7 = (_func_int **)(**(code **)(*local_78 + 0x18))();
    peVar8 = (element_type *)operator_new(0x20);
    peVar8[1]._vptr_Expression = (_func_int **)0x100000001;
    peVar8->_vptr_Expression = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f560;
    peVar10 = peVar8 + 2;
    ppuVar11 = &PTR__Member_0012f5b0;
    peVar8[2]._vptr_Expression = (_func_int **)&PTR__Member_0012f5b0;
    peVar8[3]._vptr_Expression = pp_Var7;
    break;
  case 4:
    uVar6 = (**(code **)(*local_78 + 0x28))();
    peVar8 = (element_type *)operator_new(0x20);
    peVar8[1]._vptr_Expression = (_func_int **)0x100000001;
    peVar8->_vptr_Expression = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f620;
    peVar10 = peVar8 + 2;
    ppuVar11 = &PTR__Member_0012f670;
    peVar8[2]._vptr_Expression = (_func_int **)&PTR__Member_0012f670;
    *(undefined1 *)&peVar8[3]._vptr_Expression = uVar6;
    break;
  case 5:
    (**(code **)(*local_78 + 0x30))(&local_68);
    ppuVar11 = (undefined **)extraout_RDX_01;
    goto LAB_00118674;
  case 6:
    (**(code **)(*local_78 + 0x38))(&local_68);
    ppuVar11 = (undefined **)extraout_RDX_02;
LAB_00118674:
    (this->super_UnaryOperator).super_Expression._vptr_Expression =
         (_func_int **)local_68._M_dataplus._M_p;
    (this->super_UnaryOperator).expression.
    super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68._M_string_length;
    goto LAB_0011867c;
  default:
    puVar9 = (undefined4 *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Could not cast value","");
    ExceptionObjects::bad_cast((ExceptionObjects *)&local_38,&local_68);
    uVar2 = (undefined4)local_38;
    uVar3 = local_38._4_4_;
    uVar4 = (undefined4)uStack_30;
    uVar5 = uStack_30._4_4_;
    local_38 = 0;
    uStack_30 = 0;
    *puVar9 = uVar2;
    puVar9[1] = uVar3;
    puVar9[2] = uVar4;
    puVar9[3] = uVar5;
    __cxa_throw(puVar9,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  (this->super_UnaryOperator).super_Expression._vptr_Expression = (_func_int **)peVar10;
  (this->super_UnaryOperator).expression.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar8;
LAB_0011867c:
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    ppuVar11 = (undefined **)extraout_RDX_03;
  }
  pVar12.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar11;
  pVar12.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar12.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Value> value = expression -> evaluate(env);

        if(type == Type::Object)
            return value -> asObject();
        else if(type == Type::Array)
            return value -> asArray();
        else if(type == Type::String)
            return make<String>(value -> asString());
        else if(type == Type::Double)
            return make<Double>(value -> asDouble());
        else if(type == Type::Integer)
            return make<Integer>(value -> asInteger());
        else if(type == Type::Boolean)
            return make<Boolean>(value -> asBoolean());

        throw ThrowPacket(ExceptionObjects::bad_cast("Could not cast value"));
    }